

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::checkbox::load(checkbox *this,context *context)

{
  uint *puVar1;
  _func_int *p_Var2;
  long lVar3;
  void *__s2;
  _Base_ptr p_Var4;
  _Base_ptr __n;
  int iVar5;
  session_interface *this_00;
  request *this_01;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var6;
  form_context *context_00;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar7;
  key_type local_48;
  
  p_Var2 = (this->super_base_html_input)._vptr_base_html_input[-3];
  context_00 = (form_context *)context;
  this_00 = http::context::session(context);
  session_interface::validate_request_origin(this_00);
  base_widget::auto_generate
            ((base_widget *)
             ((long)&(this->super_base_html_input)._vptr_base_html_input + (long)p_Var2),context_00)
  ;
  puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                   (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
  *puVar1 = *puVar1 | 2;
  this_01 = http::context::request(context);
  this_02 = &http::request::post_or_get_abi_cxx11_(this_01)->_M_t;
  p_Var2 = (this->super_base_html_input)._vptr_base_html_input[-3];
  lVar3 = *(long *)(p_Var2 + 0x18 + (long)&(this->super_base_html_input).type_._M_dataplus);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,lVar3,
             *(long *)(&(this->super_base_html_input).field_0x30 + (long)p_Var2) + lVar3);
  pVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(this_02,&local_48);
  _Var6 = pVar7.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_base_html_input).field_0x58 = 0;
  if (_Var6._M_node != pVar7.second._M_node._M_node) {
    __s2 = *(void **)&(this->super_base_html_input).field_0x38;
    p_Var4 = *(_Base_ptr *)&(this->super_base_html_input).field_0x40;
    do {
      __n = _Var6._M_node[2]._M_parent;
      if ((__n == p_Var4) &&
         ((__n == (_Base_ptr)0x0 ||
          (iVar5 = bcmp(*(void **)(_Var6._M_node + 2),__s2,(size_t)__n), iVar5 == 0)))) {
        (this->super_base_html_input).field_0x58 = 1;
        return;
      }
      _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node);
    } while (_Var6._M_node != pVar7.second._M_node._M_node);
  }
  return;
}

Assistant:

void checkbox::load(http::context &context)
{
	pre_load(context);
	set(true);
	std::pair<http::request::form_type::const_iterator,http::request::form_type::const_iterator> 
		range=context.request().post_or_get().equal_range(name());
	value(false);
	while(range.first != range.second) {
		if(range.first->second == identification_) {
			value(true);
			break;
		}
		++range.first;
	}
}